

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_extract_tokens(NGP_RAW_LINE *cl)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *eqsi;
  int i;
  int cl_flags;
  char *s;
  char *p;
  NGP_RAW_LINE *cl_local;
  
  s = cl->line;
  if (s == (char *)0x0) {
    return 0x16a;
  }
  cl->comment = (char *)0x0;
  cl->value = (char *)0x0;
  cl->name = (char *)0x0;
  cl->type = 0;
  cl->format = 0;
  bVar1 = false;
  eqsi._0_4_ = 0;
  while( true ) {
    if ((*s == '\0') || (*s == '\n')) {
      *cl->line = '\0';
      cl->name = cl->line;
      cl->comment = cl->line;
      cl->type = 7;
      return 0;
    }
    if ((*s != ' ') && (*s != '\t')) break;
    if (6 < (int)eqsi) {
      cl->comment = s + 1;
      _i = cl->comment;
      while( true ) {
        if (*_i == '\n') {
          *_i = '\0';
        }
        if (*_i == '\0') break;
        _i = _i + 1;
      }
      *cl->line = '\0';
      cl->name = cl->line;
      cl->type = 7;
      return 0;
    }
    s = s + 1;
    eqsi._0_4_ = (int)eqsi + 1;
  }
  cl->name = s;
  for (; (*s != '\0' && (*s != '\n')); s = s + 1) {
    iVar2 = fits_strncasecmp("HIERARCH",s,8);
    if ((iVar2 == 0) && (pcVar3 = strchr(s,0x3d), pcVar3 != (char *)0x0)) {
      bVar1 = true;
      s = pcVar3;
      goto LAB_0021779e;
    }
    if ((*s == ' ') || (*s == '\t')) goto LAB_0021779e;
    if (*s == '=') {
      bVar1 = true;
      goto LAB_0021779e;
    }
  }
  *s = '\0';
LAB_0021779e:
  if (*s != '\0') {
    *s = '\0';
    s = s + 1;
  }
  iVar2 = fits_strcasecmp("HISTORY",cl->name);
  if (((iVar2 == 0) || (iVar2 = fits_strcasecmp("COMMENT",cl->name), iVar2 == 0)) ||
     (iVar2 = fits_strcasecmp("CONTINUE",cl->name), iVar2 == 0)) {
    cl->comment = s;
    _i = cl->comment;
    while( true ) {
      if (*_i == '\n') {
        *_i = '\0';
      }
      if (*_i == '\0') break;
      _i = _i + 1;
    }
    cl->type = 7;
  }
  else {
    iVar2 = fits_strcasecmp("\\INCLUDE",cl->name);
    if (iVar2 == 0) {
      for (; (*s == ' ' || (*s == '\t')); s = s + 1) {
      }
      cl->value = s;
      _i = cl->value;
      while( true ) {
        if (*_i == '\n') {
          *_i = '\0';
        }
        if (*_i == '\0') break;
        _i = _i + 1;
      }
      cl->type = 0;
    }
    else {
      for (; (*s != '\0' && (*s != '\n')); s = s + 1) {
        if ((*s != ' ') && (*s != '\t')) {
          if ((bVar1) || (*s != '=')) {
            if (*s == '/') {
              pcVar3 = s + 1;
              if ((*pcVar3 == ' ') || (*pcVar3 == '\t')) {
                pcVar3 = s + 2;
              }
              s = pcVar3;
              cl->comment = s;
              _i = cl->comment;
              while( true ) {
                if (*_i == '\n') {
                  *_i = '\0';
                }
                if (*_i == '\0') break;
                _i = _i + 1;
              }
              return 0;
            }
            if (*s != '\'') {
              cl->value = s;
              cl->type = 0;
              while( true ) {
                if ((*s == '\0') || (*s == '\n')) {
                  *s = '\0';
                  return 0;
                }
                if ((*s == ' ') || (*s == '\t')) break;
                s = s + 1;
              }
              if (*s != '\0') {
                *s = '\0';
                s = s + 1;
              }
              goto LAB_00217c12;
            }
            _i = s + 1;
            cl->value = _i;
            cl->type = 2;
            s = _i;
            do {
              if ((*s == '\0') || (*s == '\n')) {
                *_i = '\0';
                return 0;
              }
              if (*s == '\'') {
                if ((s[1] == '\0') || (s[1] == '\n')) {
                  *_i = '\0';
                  return 0;
                }
                if ((s[1] == '\t') || (s[1] == ' ')) {
                  *_i = '\0';
                  s = s + 1;
LAB_00217c12:
                  while( true ) {
                    if ((*s == '\0') || (*s == '\n')) {
                      return 0;
                    }
                    if ((*s != ' ') && (*s != '\t')) break;
                    s = s + 1;
                  }
                  if (*s != '/') {
                    cl->format = 1;
                    return 0;
                  }
                  pcVar3 = s + 1;
                  if ((*pcVar3 == ' ') || (*pcVar3 == '\t')) {
                    pcVar3 = s + 2;
                  }
                  s = pcVar3;
                  cl->comment = s;
                  _i = cl->comment;
                  while( true ) {
                    if (*_i == '\n') {
                      *_i = '\0';
                    }
                    if (*_i == '\0') break;
                    _i = _i + 1;
                  }
                  return 0;
                }
                if (s[1] == '\'') {
                  s = s + 1;
                }
              }
              *_i = *s;
              _i = _i + 1;
              s = s + 1;
            } while( true );
          }
          bVar1 = true;
        }
      }
    }
  }
  return 0;
}

Assistant:

int	ngp_extract_tokens(NGP_RAW_LINE *cl)
 { char *p, *s;
   int	cl_flags, i;

   p = cl->line;				/* start from beginning of line */
   if (NULL == p) return(NGP_NUL_PTR);

   cl->name = cl->value = cl->comment = NULL;
   cl->type = NGP_TTYPE_UNKNOWN;
   cl->format = NGP_FORMAT_OK;

   cl_flags = 0;

   for (i=0;; i++)				/* if 8 spaces at beginning then line is comment */
    { if ((0 == *p) || ('\n' == *p))
        {					/* if line has only blanks -> write blank keyword */
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->comment = cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;		/* signal write unformatted to FITS file */
          return(NGP_OK);
        }
      if ((' ' != *p) && ('\t' != *p)) break;
      if (i >= 7)
        { 
          cl->comment = p + 1;
          for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
           { if ('\n' == *s) *s = 0;
	     if (0 == *s) break;
           }
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;
          return(NGP_OK);
        }
      p++;
    }

   cl->name = p;

   for (;;)					/* we need to find 1st whitespace */
    { if ((0 == *p) || ('\n' == *p))
        { *p = 0;
          break;
        }

      /*
        from Richard Mathar, 2002-05-03, add 10 lines:
        if upper/lowercase HIERARCH followed also by an equal sign...
      */
      if( fits_strncasecmp("HIERARCH",p,strlen("HIERARCH")) == 0 )
      {
           char * const eqsi=strchr(p,'=') ;
           if( eqsi )
           {
              cl_flags |= NGP_FOUND_EQUAL_SIGN ;
              p=eqsi ;
              break ;
           }
      }

      if ((' ' == *p) || ('\t' == *p)) break;
      if ('=' == *p)
        { cl_flags |= NGP_FOUND_EQUAL_SIGN;
          break;
        }

      p++;
    }

   if (*p) *(p++) = 0;				/* found end of keyname so terminate string with zero */

   if ((!fits_strcasecmp("HISTORY", cl->name))
    || (!fits_strcasecmp("COMMENT", cl->name))
    || (!fits_strcasecmp("CONTINUE", cl->name)))
     { cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_RAW;
       return(NGP_OK);
     }

   if (!fits_strcasecmp("\\INCLUDE", cl->name))
     {
       for (;; p++)  if ((' ' != *p) && ('\t' != *p)) break; /* skip whitespace */

       cl->value = p;
       for (s = cl->value;; s++)		/* filter out any EOS characters */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_UNKNOWN;
       return(NGP_OK);
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' == *p) || ('\t' == *p)) continue; /* skip whitespace */
      if (cl_flags & NGP_FOUND_EQUAL_SIGN) break;
      if ('=' != *p) break;			/* ignore initial equal sign */
      cl_flags |= NGP_FOUND_EQUAL_SIGN;
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   if ('\'' == *p)				/* we have found string within quotes */
     { cl->value = s = ++p;			/* set pointer to beginning of that string */
       cl->type = NGP_TTYPE_STRING;		/* signal that it is of string type */

       for (;;)					/* analyze it */
        { if ((0 == *p) || ('\n' == *p))	/* end of line -> end of string */
            { *s = 0; return(NGP_OK); }

          if ('\'' == *p)			/* we have found doublequote */
            { if ((0 == p[1]) || ('\n' == p[1]))/* doublequote is the last character in line */
                { *s = 0; return(NGP_OK); }
              if (('\t' == p[1]) || (' ' == p[1])) /* duoblequote was string terminator */
                { *s = 0; p++; break; }
              if ('\'' == p[1]) p++;		/* doublequote is inside string, convert "" -> " */ 
            }

          *(s++) = *(p++);			/* compact string in place, necess. by "" -> " conversion */
        }
     }
   else						/* regular token */
     { 
       cl->value = p;				/* set pointer to token */
       cl->type = NGP_TTYPE_UNKNOWN;		/* we dont know type at the moment */
       for (;; p++)				/* we need to find 1st whitespace */
        { if ((0 == *p) || ('\n' == *p))
            { *p = 0; return(NGP_OK); }
          if ((' ' == *p) || ('\t' == *p)) break;
        }
       if (*p)  *(p++) = 0;			/* found so terminate string with zero */
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' != *p) && ('\t' != *p)) break;	/* skip whitespace */
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   cl->format = NGP_FORMAT_ERROR;
   return(NGP_OK);				/* too many tokens ... */
 }